

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddSlotArrayDebuggerScopeProperties
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,DebuggerScope *debuggerScope,
          uint propertiesCount)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  PropertyId PVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  uint32 uVar8;
  uint i;
  uint uVar9;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x6d6,"(debuggerScope)","debuggerScope");
    if (!bVar2) goto LAB_007c35da;
    *puVar6 = 0;
  }
  if (propertiesCount == 0) {
    uVar8 = 0;
  }
  else {
    bVar2 = DebuggerScope::HasProperties(debuggerScope);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x6e2,"(debuggerScope->HasProperties())",
                                  "Properties should exist.");
      if (!bVar2) goto LAB_007c35da;
      *puVar6 = 0;
    }
    uVar9 = (((debuggerScope->scopeProperties).ptr)->
            super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).count;
    if ((int)uVar9 < 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x6e3,"(debuggerScope->scopeProperties->Count() >= 0)",
                                  "debuggerScope->scopeProperties->Count() >= 0");
      if (!bVar2) goto LAB_007c35da;
      *puVar6 = 0;
      uVar9 = (((debuggerScope->scopeProperties).ptr)->
              super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
              count;
    }
    if (uVar9 != propertiesCount) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x6e4,
                                  "((uint)debuggerScope->scopeProperties->Count() == propertiesCount)"
                                  ,"Property counts should match.");
      if (!bVar2) {
LAB_007c35da:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    uVar8 = 0;
    for (uVar9 = 0; propertiesCount != uVar9; uVar9 = uVar9 + 1) {
      pTVar7 = JsUtil::
               List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((debuggerScope->scopeProperties).ptr,uVar9);
      PVar4 = pTVar7->propId;
      uVar3 = PrependInt32(this,builder,L"SlotIndexesForDebuggerScopeSlots",pTVar7->location,
                           (BufferBuilderInt32 **)0x0);
      PVar4 = encodePossiblyBuiltInPropertyId(this,PVar4);
      uVar5 = PrependInt32(this,builder,L"PropertyIdsForDebuggerScopeSlots",PVar4,
                           (BufferBuilderInt32 **)0x0);
      uVar8 = uVar5 + uVar3 + uVar8;
    }
  }
  return uVar8;
}

Assistant:

uint32 AddSlotArrayDebuggerScopeProperties(BufferBuilderList & builder, DebuggerScope* debuggerScope, uint propertiesCount)
    {
        Assert(debuggerScope);
        if (propertiesCount == 0)
        {
            return 0u;
        }

        uint32 size = 0u;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start SlotArrayDebuggerScopeProperties"), magicStartOfDebuggerScopeProperties);
#endif // BYTE_CODE_MAGIC_CONSTANTS

        AssertMsg(debuggerScope->HasProperties(), "Properties should exist.");
        Assert(debuggerScope->scopeProperties->Count() >= 0);
        AssertMsg((uint)debuggerScope->scopeProperties->Count() == propertiesCount, "Property counts should match.");
        for (uint i = 0u; i < propertiesCount; ++i)
        {
            DebuggerScopeProperty scopeProperty = debuggerScope->scopeProperties->Item(i);
            size += PrependInt32(builder, _u("SlotIndexesForDebuggerScopeSlots"), scopeProperty.location);

            PropertyId propertyId = encodePossiblyBuiltInPropertyId(scopeProperty.propId);
            size += PrependInt32(builder, _u("PropertyIdsForDebuggerScopeSlots"), propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End SlotArrayDebuggerScopeProperties"), magicEndOfDebuggerScopeProperties);
#endif // BYTE_CODE_MAGIC_CONSTANTS

        return size;
    }